

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_relation.cpp
# Opt level: O1

string * __thiscall
duckdb::OrderRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,OrderRelation *this,idx_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  string *psVar3;
  long *plVar4;
  reference pvVar5;
  pointer pPVar6;
  Relation *pRVar7;
  long *plVar8;
  size_type *psVar9;
  size_type __n;
  string str;
  string local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  idx_t local_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58 = __return_storage_ptr__;
  Relation::RenderWhitespace_abi_cxx11_(&local_a0,(Relation *)depth,depth);
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_a0);
  local_80 = &local_70;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_70 = *plVar8;
    lStack_68 = plVar4[3];
  }
  else {
    local_70 = *plVar8;
    local_80 = (long *)*plVar4;
  }
  local_78 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar1 = &local_a0.field_2;
  local_60 = depth;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)&local_80);
      }
      pvVar5 = vector<duckdb::OrderByNode,_true>::operator[](&this->orders,__n);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&pvVar5->expression);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(local_50,pPVar6);
      vector<duckdb::OrderByNode,_true>::operator[](&this->orders,__n);
      plVar4 = (long *)::std::__cxx11::string::append((char *)local_50);
      psVar9 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0.field_2._8_8_ = plVar4[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->orders).
                                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                 .
                                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->orders).
                                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                 .
                                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  ::std::__cxx11::string::append((char *)&local_80);
  pRVar7 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar7->_vptr_Relation[6])(&local_a0,pRVar7,local_60 + 1);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_80);
  psVar3 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar9) {
    lVar2 = plVar4[3];
    (local_58->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&local_58->field_2 + 8) = lVar2;
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)*plVar4;
    (local_58->field_2)._M_allocated_capacity = *psVar9;
  }
  local_58->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  return psVar3;
}

Assistant:

string OrderRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "Order [";
	for (idx_t i = 0; i < orders.size(); i++) {
		if (i != 0) {
			str += ", ";
		}
		str += orders[i].expression->ToString() + (orders[i].type == OrderType::ASCENDING ? " ASC" : " DESC");
	}
	str += "]\n";
	return str + child->ToString(depth + 1);
}